

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

string * __thiscall
sqlite_orm::internal::
table_t<relive::Url,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,int,int_const&(relive::Url::*)()const,void(relive::Url::*)(int)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>>
::find_column_name<int,relive::Url,void>
          (string *__return_storage_ptr__,
          table_t<relive::Url,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,int,int_const&(relive::Url::*)()const,void(relive::Url::*)(int)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>>
          *this,offset_in_Url_to_int m)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(offset_in_Url_to_int *)(this + 0x98) == m) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }